

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  int *piVar6;
  mbedtls_ssl_handshake_params *pmVar7;
  uchar *puVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  uchar *puVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  byte bVar26;
  bool bVar27;
  uint local_48;
  
  uVar16 = ssl->in_msglen;
  uVar2 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (uVar16 < uVar2) {
    return -0x7200;
  }
  piVar6 = (int *)ssl->in_msg;
  lVar15 = (ulong)*(byte *)((long)piVar6 + 1) * 0x10000;
  lVar17 = (ulong)*(byte *)((long)piVar6 + 2) * 0x100;
  bVar4 = *(byte *)((long)piVar6 + 3);
  uVar19 = (lVar17 + lVar15 | (ulong)bVar4) + uVar2;
  ssl->in_hslen = uVar19;
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (uVar19 <= uVar16) {
      return 0;
    }
    return -0x7080;
  }
  pmVar7 = ssl->handshake;
  if (pmVar7 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar24 = (uint)(ushort)(*(ushort *)(piVar6 + 1) << 8 | *(ushort *)(piVar6 + 1) >> 8);
    if (ssl->state == 0x10) {
      if ((char)*piVar6 != '\x01') {
LAB_001130c0:
        if (((uVar24 == pmVar7->in_flight_start_seq - 1) && ((char)*piVar6 != '\x03')) &&
           (iVar10 = mbedtls_ssl_resend(ssl), iVar10 != 0)) {
          return iVar10;
        }
        return -0x6580;
      }
    }
    else if (uVar24 != pmVar7->in_msg_seq) goto LAB_001130c0;
  }
  if (((uVar16 < uVar19) || (iVar10 = bcmp((void *)((long)piVar6 + 6),"",3), iVar10 != 0)) ||
     (iVar10 = bcmp((void *)((long)piVar6 + 9),(void *)((long)piVar6 + 1),3), iVar10 != 0)) {
    if (pmVar7 == (mbedtls_ssl_handshake_params *)0x0) {
      return -0x7080;
    }
    piVar11 = (int *)pmVar7->hs_msg;
    if (piVar11 != (int *)0x0) goto LAB_0011314b;
    if (0x4000 < (uint)uVar19) {
      return -0x7080;
    }
    piVar11 = (int *)calloc(1,((uVar19 - 0xc >> 3) + uVar19 + 1) - (ulong)((uVar19 - 0xc & 7) == 0))
    ;
    pmVar7->hs_msg = (uchar *)piVar11;
    if (piVar11 == (int *)0x0) {
      return -0x7f00;
    }
    *piVar11 = *piVar6;
    *(short *)(piVar11 + 1) = (short)piVar6[1];
    *(undefined2 *)((long)piVar11 + 9) = *(undefined2 *)((long)piVar11 + 1);
    *(undefined1 *)((long)piVar11 + 0xb) = *(undefined1 *)((long)piVar11 + 3);
  }
  else {
    if (pmVar7 == (mbedtls_ssl_handshake_params *)0x0) {
      return 0;
    }
    piVar11 = (int *)pmVar7->hs_msg;
    if (piVar11 == (int *)0x0) {
      return 0;
    }
LAB_0011314b:
    if (*piVar11 != *piVar6) {
      return -0x7200;
    }
  }
  uVar14 = uVar19 - 0xc;
  bVar26 = *(byte *)(piVar6 + 2);
  uVar20 = (ulong)((uint)*(byte *)((long)piVar6 + 7) << 8 |
                  (uint)*(byte *)((long)piVar6 + 6) << 0x10) | (ulong)bVar26;
  uVar24 = (uint)*(byte *)((long)piVar6 + 10) << 8 | (uint)*(byte *)((long)piVar6 + 9) << 0x10;
  bVar5 = *(byte *)((long)piVar6 + 0xb);
  sVar18 = (ulong)uVar24 + (ulong)bVar5;
  if (uVar14 < sVar18 + uVar20) {
    return -0x7200;
  }
  uVar1 = sVar18 + 0xc;
  if (uVar16 < uVar1) {
    return -0x7200;
  }
  memcpy((void *)((long)piVar11 + uVar20 + 0xc),piVar6 + 3,sVar18);
  bVar26 = bVar26 & 7;
  if (bVar26 != 0) {
    bVar26 = 8 - bVar26;
    uVar16 = uVar20 >> 3;
    uVar12 = (uint)bVar26;
    uVar25 = (uint)sVar18;
    uVar13 = (uint)bVar26;
    if (uVar25 < uVar12 || uVar25 == uVar13) {
      local_48 = (uint)bVar5;
      iVar10 = uVar13 - (uVar24 + local_48);
      uVar23 = 0;
      while (bVar27 = sVar18 != 0, sVar18 = sVar18 - 1, bVar27) {
        pbVar3 = (byte *)((long)piVar11 + uVar16 + uVar19);
        *pbVar3 = *pbVar3 | (byte)(1 << ((byte)iVar10 & 0x1f));
        iVar10 = iVar10 + 1;
      }
    }
    else {
      bVar26 = *(byte *)((long)piVar11 + uVar16 + uVar19);
      while (uVar13 = uVar13 - 1, uVar13 != 0xffffffff) {
        bVar26 = bVar26 | (byte)(1 << ((byte)uVar13 & 0x1f));
      }
      uVar20 = uVar20 + uVar12;
      uVar23 = sVar18 - uVar12;
      *(byte *)((long)piVar11 + uVar16 + uVar19) = bVar26;
    }
    sVar18 = uVar23;
    if (uVar25 <= uVar12) goto LAB_0011337a;
  }
  if ((sVar18 & 7) != 0) {
    uVar16 = uVar20 + sVar18 >> 3;
    bVar26 = *(byte *)((long)piVar11 + uVar16 + uVar19);
    for (iVar10 = 8 - ((uint)sVar18 & 7); iVar10 != 8; iVar10 = iVar10 + 1) {
      bVar26 = bVar26 | (byte)(1 << ((byte)iVar10 & 0x1f));
    }
    *(byte *)((long)piVar11 + uVar16 + uVar19) = bVar26;
  }
  memset((void *)((long)piVar11 + (uVar20 >> 3) + uVar19),0xff,sVar18 >> 3);
LAB_0011337a:
  uVar16 = 0;
  while (uVar14 >> 3 != uVar16) {
    lVar9 = uVar16 + lVar17 + (ulong)bVar4 + uVar2 + lVar15;
    uVar16 = uVar16 + 1;
    if (*(char *)((long)piVar11 + lVar9) != -1) {
      return -0x6580;
    }
  }
  lVar17 = 0;
  while (-lVar17 != (ulong)((uint)uVar14 & 7)) {
    iVar10 = (int)lVar17;
    lVar17 = lVar17 + -1;
    if ((*(byte *)((long)piVar11 + (uVar14 >> 3) + uVar19) >> (iVar10 + 7U & 0x1f) & 1) == 0) {
      return -0x6580;
    }
  }
  if (ssl->in_msglen <= uVar1) {
    uVar2 = ssl->next_record_offset;
    sVar18 = ssl->in_left - uVar2;
    if (uVar2 <= ssl->in_left && sVar18 != 0) {
      puVar8 = ssl->in_hdr;
      sVar21 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar8;
      ssl->next_record_offset = sVar21;
      puVar22 = (uchar *)(sVar21 + sVar18);
      ssl->in_left = (size_t)puVar22;
      if (ssl->in_buf + (0x414d - (long)puVar8) < puVar22) {
        return -0x6a00;
      }
      memmove(ssl->in_msg + ssl->in_hslen,puVar8 + uVar2,sVar18);
    }
    memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
    free(ssl->handshake->hs_msg);
    ssl->handshake->hs_msg = (uchar *)0x0;
    return 0;
  }
  return -0x7080;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        if( ssl->handshake != NULL &&
            ( ( ssl->state   != MBEDTLS_SSL_HANDSHAKE_OVER &&
                recv_msg_seq != ssl->handshake->in_msg_seq ) ||
              ( ssl->state  == MBEDTLS_SSL_HANDSHAKE_OVER &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_HELLO ) ) )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}